

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iso8601.c
# Opt level: O3

_Bool get_tok(char *terminals,char **ptr,int32_t *remaining,char **out,int32_t *out_len)

{
  int iVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  int32_t iVar5;
  char *pcVar6;
  bool bVar7;
  
  if (*remaining == 0) {
    *out = "";
  }
  pcVar2 = *ptr;
  *out = pcVar2;
  *out_len = -1;
  iVar4 = *remaining;
  if (iVar4 == 0) {
    iVar5 = 0;
  }
  else {
    do {
      cVar3 = *terminals;
      if (cVar3 == '\0') {
        bVar7 = false;
      }
      else {
        pcVar6 = terminals + 1;
        do {
          bVar7 = *pcVar2 == cVar3;
          if (bVar7) break;
          cVar3 = *pcVar6;
          pcVar6 = pcVar6 + 1;
        } while (cVar3 != '\0');
      }
      pcVar2 = pcVar2 + 1;
      *ptr = pcVar2;
      *remaining = iVar4 + -1;
      iVar1 = *out_len;
      *out_len = iVar1 + 1;
      iVar4 = *remaining;
    } while ((iVar4 != 0) && (!bVar7));
    if (bVar7) goto LAB_001102fb;
    iVar5 = iVar1 + 2;
  }
  *out_len = iVar5;
LAB_001102fb:
  return SUB81(pcVar2,0);
}

Assistant:

static bool
get_tok (const char *terminals,
         const char **ptr,
         int32_t *remaining,
         const char **out,
         int32_t *out_len)
{
   const char *terminal;
   bool found_terminal = false;

   if (!*remaining) {
      *out = "";
      *out_len = 0;
   }

   *out = *ptr;
   *out_len = -1;

   for (; *remaining && !found_terminal;
        (*ptr)++, (*remaining)--, (*out_len)++) {
      for (terminal = terminals; *terminal; terminal++) {
         if (**ptr == *terminal) {
            found_terminal = true;
            break;
         }
      }
   }

   if (!found_terminal) {
      (*out_len)++;
   }

   return found_terminal;
}